

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O0

idx_t __thiscall
duckdb::RowGroup::GetSelVector
          (RowGroup *this,TransactionData transaction,idx_t vector_idx,SelectionVector *sel_vector,
          idx_t max_count)

{
  TransactionData transaction_00;
  bool bVar1;
  idx_t in_RCX;
  RowGroup *in_stack_00000018;
  idx_t in_stack_00000020;
  SelectionVector *in_stack_00000028;
  idx_t in_stack_00000030;
  optional_ptr<duckdb::RowVersionManager,_true> vinfo;
  transaction_t in_stack_00000060;
  optional_ptr<duckdb::RowVersionManager,_true> *in_stack_ffffffffffffffa0;
  RowVersionManager *local_30;
  idx_t local_28;
  idx_t local_8;
  
  local_28 = in_RCX;
  local_30 = (RowVersionManager *)GetVersionInfo(in_stack_00000018);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_30);
  if (bVar1) {
    optional_ptr<duckdb::RowVersionManager,_true>::operator->(in_stack_ffffffffffffffa0);
    transaction_00.transaction_id = (transaction_t)this;
    transaction_00.transaction.ptr = (DuckTransaction *)vector_idx;
    transaction_00.start_time = in_stack_00000060;
    local_8 = RowVersionManager::GetSelVector
                        (vinfo.ptr,transaction_00,in_stack_00000030,in_stack_00000028,
                         in_stack_00000020);
  }
  else {
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

idx_t RowGroup::GetSelVector(TransactionData transaction, idx_t vector_idx, SelectionVector &sel_vector,
                             idx_t max_count) {
	auto vinfo = GetVersionInfo();
	if (!vinfo) {
		return max_count;
	}
	return vinfo->GetSelVector(transaction, vector_idx, sel_vector, max_count);
}